

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  FILE *pFVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  FILE *pFVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  LibDefHandler *unaff_R13;
  uint8_t *puVar11;
  char buf [256];
  char acStack_1d0 [88];
  BuildCtx *pBStack_178;
  BuildCtx *pBStack_170;
  LibDefHandler *pLStack_168;
  FILE *pFStack_160;
  char *pcStack_158;
  code *pcStack_150;
  FILE *local_140;
  byte local_138;
  char cStack_137;
  char cStack_136;
  undefined5 uStack_135;
  int local_130;
  
  if (ctx->mode - BUILD_ffdef < 3) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar9 = "/* This is a generated file. DO NOT EDIT! */\n\n";
    sVar8 = 0x2e;
LAB_0010b490:
    pcStack_150 = (code *)0x10b49a;
    fwrite(pcVar9,sVar8,1,pFVar6);
    if (ctx->mode == BUILD_recdef) {
      pcStack_150 = (code *)0x10b4bd;
      fwrite("static const uint16_t recff_idmap[] = {\n0,\n0x0100",0x31,1,(FILE *)ctx->fp);
    }
  }
  else if (ctx->mode == BUILD_vmdef) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar9 = "ffnames = {\n[0]=\"Lua\",\n\"C\",\n";
    sVar8 = 0x1c;
    goto LAB_0010b490;
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  ppcVar1 = ctx->args;
  ctx->args = ppcVar1 + 1;
  pcVar9 = *ppcVar1;
  pFVar6 = _stdin;
  while (_stdin = pFVar6, pcVar9 != (char *)0x0) {
    if ((*pcVar9 != '-') || (pcVar9[1] != '\0')) {
      pcStack_150 = (code *)0x10b51b;
      pFVar6 = fopen(pcVar9,"r");
      pBStack_170 = ctx;
      if (pFVar6 == (FILE *)0x0) {
LAB_0010b8f2:
        pcStack_150 = libdef_endmodule;
        pcVar10 = pcVar9;
        emit_lib_cold_1();
        if (modstate != 0) {
          pcStack_158 = "LJLIB_";
          pBStack_178 = ctx;
          pLStack_168 = unaff_R13;
          pFStack_160 = pFVar6;
          pcStack_150 = (code *)pcVar9;
          if (modstate == 1) {
            fwrite("  (lua_CFunction)0",0x12,1,*(FILE **)(pcVar10 + 0x10));
          }
          fwrite("\n};\n",4,1,*(FILE **)(pcVar10 + 0x10));
          fprintf(*(FILE **)(pcVar10 + 0x10),"static const uint8_t %s%s[] = {\n","lj_lib_init_",
                  modname);
          acStack_1d0[0] = '\0';
          puVar11 = obuf;
          if (obuf < optr) {
            iVar4 = 0;
            do {
              iVar5 = sprintf(acStack_1d0 + iVar4,"%d,",(ulong)*puVar11);
              iVar4 = iVar4 + iVar5;
              if (0x4a < iVar4) {
                iVar4 = 0;
                fprintf(*(FILE **)(pcVar10 + 0x10),"%s\n",acStack_1d0);
                acStack_1d0[0] = '\0';
              }
              puVar11 = puVar11 + 1;
            } while (puVar11 < optr);
          }
          fprintf(*(FILE **)(pcVar10 + 0x10),"%s%d\n};\n#endif\n\n",acStack_1d0,0xff);
        }
        return;
      }
    }
    modstate = 0;
    regfunc = 0;
    pcStack_150 = (code *)0x10b547;
    pcVar9 = fgets((char *)&local_138,0x100,pFVar6);
    pFVar3 = pFVar6;
    pFVar2 = local_140;
    while (local_140 = pFVar3, pcVar9 != (char *)0x0) {
      if ((((local_138 == 0x23) && (cStack_137 == 'i')) && (cStack_136 == 'f')) &&
         ((CONCAT35((undefined3)local_130,uStack_135) == 0xa32355f4a4c20 &&
           CONCAT53(uStack_135,0x666923) == 0x355f4a4c20666923 ||
          (local_130 == 0xa0d32 && CONCAT53(uStack_135,0x666923) == 0x355f4a4c20666923)))) {
        pcStack_150 = (code *)0x10b682;
        pcVar9 = fgets((char *)&local_138,0x100,pFVar6);
        if (pcVar9 != (char *)0x0) {
          iVar4 = 1;
          do {
            if (cStack_136 == 'n' && (cStack_137 == 'e' && (local_138 ^ 0x23) == 0)) {
              iVar4 = iVar4 + -1;
              if (iVar4 == 0) break;
            }
            else {
              iVar4 = iVar4 + (uint)(cStack_136 == 'f' &&
                                    ((local_138 ^ 0x23) == 0 && cStack_137 == 'i'));
            }
            pcStack_150 = (code *)0x10b6d9;
            pcVar9 = fgets((char *)&local_138,0x100,local_140);
          } while (pcVar9 != (char *)0x0);
        }
      }
      else {
        pcStack_150 = (code *)0x10b5ca;
        for (pcVar9 = strstr((char *)&local_138,"LJLIB_"); pcVar9 != (char *)0x0;
            pcVar9 = strstr(pcVar9,"LJLIB_")) {
          pcVar9 = pcVar9 + 6;
          unaff_R13 = libdef_handlers + 1;
          pcVar10 = "MODULE_";
          while( true ) {
            pcStack_150 = (code *)0x10b5f0;
            pFVar6 = (FILE *)strlen(pcVar10);
            pcStack_150 = (code *)0x10b601;
            iVar4 = strncmp(pcVar9,pcVar10,(size_t)pFVar6);
            if (iVar4 == 0) break;
            pcVar10 = unaff_R13->suffix;
            unaff_R13 = unaff_R13 + 1;
            if (pcVar10 == (char *)0x0) {
              pcStack_150 = (code *)0x10b8f2;
              emit_lib_cold_2();
              pBStack_170 = (BuildCtx *)0x0;
              goto LAB_0010b8f2;
            }
          }
          pcVar9 = pcVar9 + (long)pFVar6;
          if (unaff_R13[-1].stop == (char *)0x0) {
            sVar8 = 0;
          }
          else {
            pcStack_150 = (code *)0x10b62b;
            sVar8 = strcspn(pcVar9,unaff_R13[-1].stop);
          }
          if (pcVar9[sVar8] != '\0') {
            pcVar9[sVar8] = '\0';
            pcStack_150 = (code *)0x10b651;
            (*unaff_R13[-1].func)(ctx,pcVar9,unaff_R13[-1].arg);
            pcVar9 = pcVar9 + sVar8 + 1;
          }
          pcStack_150 = (code *)0x10b662;
        }
      }
      pFVar6 = local_140;
      pcStack_150 = (code *)0x10b6f5;
      pcVar9 = fgets((char *)&local_138,0x100,local_140);
      pFVar3 = local_140;
      pFVar2 = local_140;
    }
    pcStack_150 = (code *)0x10b706;
    local_140 = pFVar2;
    fclose(pFVar6);
    if (ctx->mode == BUILD_libdef) {
      pcStack_150 = (code *)0x10b717;
      libdef_endmodule(ctx);
    }
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    pFVar6 = _stdin;
    pcVar9 = *ppcVar1;
  }
  switch(ctx->mode) {
  case BUILD_bcdef:
    pcStack_150 = (code *)0x10b77e;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10b799;
    fwrite("LJ_DATADEF const uint16_t lj_bc_mode[] = {\n",0x2b,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10b7b4;
    fwrite("BCDEF(BCMODE)\n",0xe,1,(FILE *)ctx->fp);
    if (1 < ffasmfunc) {
      uVar7 = ffasmfunc + 1;
      do {
        pcStack_150 = (code *)0x10b7df;
        fwrite("BCMODE_FF,\n",0xb,1,(FILE *)ctx->fp);
        uVar7 = uVar7 - 1;
      } while (2 < uVar7);
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar9 = "BCMODE_FF\n};\n\n";
    sVar8 = 0xe;
    break;
  case BUILD_ffdef:
    pcStack_150 = (code *)0x10b89d;
    fwrite("\n#undef FFDEF\n\n",0xf,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10b8b6;
    fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
            (ulong)(uint)ffasmfunc);
    return;
  default:
    goto switchD_0010b761_caseD_7;
  case BUILD_recdef:
    pcStack_150 = (code *)0x10b817;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pcStack_150 = (code *)0x10b832;
    fwrite("static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c",0x3b,1,(FILE *)ctx->fp);
    if (obuf[0] != '\0') {
      puVar11 = obuf;
      do {
        pcStack_150 = (code *)0x10b85b;
        fprintf((FILE *)ctx->fp,",\nrecff_%s",puVar11);
        pcStack_150 = (code *)0x10b863;
        sVar8 = strlen((char *)puVar11);
        puVar11 = puVar11 + sVar8 + 1;
      } while (*puVar11 != '\0');
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar9 = "\n};\n\n";
    sVar8 = 5;
    break;
  case BUILD_vmdef:
    pFVar6 = (FILE *)ctx->fp;
    pcVar9 = "},\n\n";
    sVar8 = 4;
  }
  pcStack_150 = (code *)0x10b8d3;
  fwrite(pcVar9,sVar8,1,pFVar6);
switchD_0010b761_caseD_7:
  return;
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
        int ok = 1;
        if (!strcmp(buf, "#if LJ_52\n") || !strcmp(buf, "#if LJ_52\r\n"))
          ok = LJ_52;
        else if (!strcmp(buf, "#if LJ_HASJIT\n") || !strcmp(buf, "#if LJ_HASJIT\r\n"))
          ok = LJ_HASJIT;
        else if (!strcmp(buf, "#if LJ_HASFFI\n") || !strcmp(buf, "#if LJ_HASFFI\r\n"))
          ok = LJ_HASFFI;
        else if (!strcmp(buf, "#if LJ_HASBUFFER\n") || !strcmp(buf, "#if LJ_HASBUFFER\r\n"))
          ok = LJ_HASBUFFER;
        if (!ok) {
          int lvl = 1;
          while (fgets(buf, sizeof(buf), fp) != NULL) {
            if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
              if (--lvl == 0) break;
            } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
              lvl++;
            }
          }
          continue;
        }
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
        const LibDefHandler *ldh;
        p += sizeof(LIBDEF_PREFIX)-1;
        for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
          size_t n, len = strlen(ldh->suffix);
          if (!strncmp(p, ldh->suffix, len)) {
            p += len;
            n = ldh->stop ? strcspn(p, ldh->stop) : 0;
            if (!p[n]) break;
            p[n] = '\0';
            ldh->func(ctx, p, ldh->arg);
            p += n+1;
            break;
          }
        }
        if (ldh->suffix == NULL) {
          buf[strlen(buf)-1] = '\0';
          fprintf(stderr, "Error: unknown library definition tag %s%s\n",
            LIBDEF_PREFIX, p);
          exit(1);
        }
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}